

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void kj::_::Debug::log<char_const(&)[94]>
               (char *file,char line [7],LogSeverity severity,char *macroArgs,char (*params) [94])

{
  char (*pacVar1) [94];
  LogSeverity line_00;
  uint uVar2;
  Debug *this;
  undefined4 in_register_00000014;
  ArrayPtr<kj::String> AVar3;
  ArrayPtr<kj::String> in_stack_ffffffffffffff28;
  String *local_a0;
  undefined1 local_48 [8];
  char argValues [1] [7];
  char (*local_28) [94];
  char (*params_local) [94];
  char *macroArgs_local;
  LogSeverity severity_local;
  char *file_local;
  
  macroArgs_local._4_4_ = line._0_4_;
  local_28 = params;
  params_local = (char (*) [94])macroArgs;
  macroArgs_local._0_4_ = severity;
  _severity_local = (Debug *)file;
  str<char_const(&)[94]>
            ((String *)local_48,(kj *)params,(char (*) [94])CONCAT44(in_register_00000014,severity))
  ;
  this = _severity_local;
  uVar2 = macroArgs_local._4_4_;
  line_00 = (LogSeverity)macroArgs_local;
  pacVar1 = params_local;
  AVar3 = arrayPtr<kj::String>((String *)local_48,1);
  logInternal(this,(char *)(ulong)uVar2,line_00,(LogSeverity)pacVar1,(char *)AVar3.ptr,
              in_stack_ffffffffffffff28);
  local_a0 = (String *)&stack0xffffffffffffffd0;
  do {
    local_a0 = local_a0 + -1;
    String::~String(local_a0);
  } while (local_a0 != (String *)local_48);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}